

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.h
# Opt level: O0

void __thiscall
Fixpp::result::
Result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fixpp::ErrorKind>
::Result(Result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fixpp::ErrorKind>
         *this,Result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fixpp::ErrorKind>
               *other)

{
  bool bVar1;
  Result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fixpp::ErrorKind>
  *other_local;
  Result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fixpp::ErrorKind>
  *this_local;
  
  details::
  Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fixpp::ErrorKind>
  ::Storage(&this->storage_);
  bVar1 = isOk(other);
  if (bVar1) {
    details::
    Constructor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fixpp::ErrorKind>
    ::copy((EVP_PKEY_CTX *)&other->storage_,(EVP_PKEY_CTX *)&this->storage_);
    this->ok_ = true;
  }
  else {
    details::
    Constructor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fixpp::ErrorKind>
    ::copy((EVP_PKEY_CTX *)&other->storage_,(EVP_PKEY_CTX *)&this->storage_);
    this->ok_ = false;
  }
  return;
}

Assistant:

Result(const Result& other) {
        if (other.isOk()) {
            details::Constructor<T, E>::copy(other.storage_, storage_, details::ok_tag());
            ok_ = true;
        } else {
            details::Constructor<T, E>::copy(other.storage_, storage_, details::err_tag());
            ok_ = false;
        }
    }